

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindLinks(lemon *lemp)

{
  state *psVar1;
  config *pcVar2;
  plink *ppVar3;
  int iVar4;
  long lVar5;
  config **ppcVar6;
  plink **pppVar7;
  
  iVar4 = lemp->nstate;
  for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
    psVar1 = lemp->sorted[lVar5];
    ppcVar6 = &psVar1->cfp;
    while (pcVar2 = *ppcVar6, pcVar2 != (config *)0x0) {
      pcVar2->stp = psVar1;
      ppcVar6 = &pcVar2->next;
    }
  }
  for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
    ppcVar6 = &lemp->sorted[lVar5]->cfp;
    while (pcVar2 = *ppcVar6, pcVar2 != (config *)0x0) {
      pppVar7 = &pcVar2->bplp;
      while (ppVar3 = *pppVar7, ppVar3 != (plink *)0x0) {
        Plink_add(&ppVar3->cfp->fplp,pcVar2);
        pppVar7 = &ppVar3->next;
      }
      ppcVar6 = &pcVar2->next;
    }
    iVar4 = lemp->nstate;
  }
  return;
}

Assistant:

void FindLinks(struct lemon *lemp)
{
  int i;
  struct config *cfp, *other;
  struct state *stp;
  struct plink *plp;

  /* Housekeeping detail:
  ** Add to every propagate link a pointer back to the state to
  ** which the link is attached. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){
      cfp->stp = stp;
    }
  }

  /* Convert all backlinks into forward links.  Only the forward
  ** links are used in the follow-set computation. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){
      for(plp=cfp->bplp; plp; plp=plp->next){
        other = plp->cfp;
        Plink_add(&other->fplp,cfp);
      }
    }
  }
}